

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::RefPtr<wabt::interp::HostFunc>::RefPtr
          (RefPtr<wabt::interp::HostFunc> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  HostFunc *pHVar2;
  Index IVar3;
  interp *this_00;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if ((((ulong)pOVar1 & 1) == 0) && (pOVar1->kind_ == HostFunc)) {
    IVar3 = Store::NewRoot(store,ref);
    this->root_index_ = IVar3;
    pHVar2 = (HostFunc *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pHVar2 & 1) == 0) {
      this->obj_ = pHVar2;
      this->store_ = store;
      return;
    }
  }
  else {
    this_00 = (interp *)0x0;
    if (ref.index != 0) {
      if (((ulong)pOVar1 & 1) != 0) goto LAB_0014ba76;
      this_00 = (interp *)(ulong)pOVar1->kind_;
    }
    interp::RefPtr(this_00);
  }
LAB_0014ba76:
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe5,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}